

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  ENetSocket EVar1;
  enet_uint32 eVar2;
  ENetPeer **ppEVar3;
  ENetPeer *pEVar4;
  enet_uint32 in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  ENetAddress *in_RDI;
  enet_uint32 in_R8D;
  int i;
  ENetPeer *currentPeer;
  ENetHost *host;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  ENetAddress *in_stack_ffffffffffffffc8;
  size_t local_20;
  ENetHost *local_8;
  
  if (in_RSI < 0x1000000) {
    local_8 = (ENetHost *)enet_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
    if (local_8 == (ENetHost *)0x0) {
      local_8 = (ENetHost *)0x0;
    }
    else {
      memset(local_8,0,0x2b50);
      ppEVar3 = (ENetPeer **)
                enet_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_8->peer_list = ppEVar3;
      if (local_8->peer_list == (ENetPeer **)0x0) {
        enet_free((void *)0x104e97);
        local_8 = (ENetHost *)0x0;
      }
      else {
        for (iVar5 = 0; (ulong)(long)iVar5 < in_RSI; iVar5 = iVar5 + 1) {
          pEVar4 = (ENetPeer *)enet_malloc(CONCAT44(iVar5,in_stack_ffffffffffffffc0));
          local_8->peer_list[iVar5] = pEVar4;
          memset(local_8->peer_list[iVar5],0,0x1d8);
        }
        EVar1 = enet_socket_create(0);
        local_8->socket = EVar1;
        if ((local_8->socket == -1) ||
           ((in_RDI != (ENetAddress *)0x0 &&
            (iVar5 = enet_socket_bind((ENetSocket)((ulong)local_8 >> 0x20),in_stack_ffffffffffffffc8
                                     ), iVar5 < 0)))) {
          if (local_8->socket != -1) {
            enet_socket_destroy(0);
          }
          for (iVar5 = 0; (ulong)(long)iVar5 < in_RSI; iVar5 = iVar5 + 1) {
            enet_free((void *)0x104f83);
          }
          enet_free((void *)0x104f9e);
          enet_free((void *)0x104fa8);
          local_8 = (ENetHost *)0x0;
        }
        else {
          enet_socket_set_option
                    ((ENetSocket)((ulong)in_RDI >> 0x20),(ENetSocketOption)in_RDI,
                     (int)(in_RSI >> 0x20));
          enet_socket_set_option
                    ((ENetSocket)((ulong)in_RDI >> 0x20),(ENetSocketOption)in_RDI,
                     (int)(in_RSI >> 0x20));
          enet_socket_set_option
                    ((ENetSocket)((ulong)in_RDI >> 0x20),(ENetSocketOption)in_RDI,
                     (int)(in_RSI >> 0x20));
          enet_socket_set_option
                    ((ENetSocket)((ulong)in_RDI >> 0x20),(ENetSocketOption)in_RDI,
                     (int)(in_RSI >> 0x20));
          if ((in_RDI != (ENetAddress *)0x0) &&
             (iVar5 = enet_socket_get_address((ENetSocket)local_8,in_stack_ffffffffffffffc8),
             iVar5 < 0)) {
            local_8->address = *in_RDI;
          }
          if ((in_RDX == 0) || (0xff < in_RDX)) {
            local_20 = 0xff;
          }
          else {
            local_20 = in_RDX;
            if (in_RDX == 0) {
              local_20 = 1;
            }
          }
          local_8->randomSeed = (enet_uint32)local_8;
          eVar2 = enet_host_random_seed();
          local_8->randomSeed = eVar2 + local_8->randomSeed;
          local_8->randomSeed = local_8->randomSeed << 0x10 | local_8->randomSeed >> 0x10;
          local_8->channelLimit = local_20;
          local_8->incomingBandwidth = in_ECX;
          local_8->outgoingBandwidth = in_R8D;
          local_8->bandwidthThrottleEpoch = 0;
          local_8->recalculateBandwidthLimits = 0;
          local_8->mtu = 0x578;
          local_8->peerCount = in_RSI;
          local_8->commandCount = 0;
          local_8->bufferCount = 0;
          local_8->checksum = (ENetChecksumCallback)0x0;
          (local_8->receivedAddress).host = 0;
          (local_8->receivedAddress).port = 0;
          local_8->receivedData = (enet_uint8 *)0x0;
          local_8->receivedDataLength = 0;
          local_8->totalSentData = 0;
          local_8->totalSentPackets = 0;
          local_8->totalReceivedData = 0;
          local_8->totalReceivedPackets = 0;
          local_8->connectedPeers = 0;
          local_8->bandwidthLimitedPeers = 0;
          local_8->duplicatePeers = 0xffffff;
          local_8->maximumPacketSize = 0x2000000;
          local_8->maximumWaitingData = 0x2000000;
          (local_8->compressor).context = (void *)0x0;
          (local_8->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (local_8->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (local_8->compressor).destroy = (_func_void_void_ptr *)0x0;
          local_8->intercept = (ENetInterceptCallback)0x0;
          enet_list_clear(&local_8->dispatchQueue);
          for (eVar2 = 0; (ulong)(long)(int)eVar2 < local_8->peerCount; eVar2 = eVar2 + 1) {
            pEVar4 = local_8->peer_list[(int)eVar2];
            pEVar4->host = local_8;
            pEVar4->incomingPeerID = eVar2;
            pEVar4->incomingSessionID = 0xff;
            pEVar4->outgoingSessionID = 0xff;
            pEVar4->data = (void *)0x0;
            enet_list_clear(&pEVar4->acknowledgements);
            enet_list_clear(&pEVar4->sentReliableCommands);
            enet_list_clear(&pEVar4->sentUnreliableCommands);
            enet_list_clear(&pEVar4->outgoingReliableCommands);
            enet_list_clear(&pEVar4->outgoingUnreliableCommands);
            enet_list_clear(&pEVar4->dispatchedCommands);
            enet_peer_reset((ENetPeer *)0x10533b);
          }
        }
      }
    }
  }
  else {
    local_8 = (ENetHost *)0x0;
  }
  return local_8;
}

Assistant:

ENetHost *
enet_host_create (const ENetAddress * address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth)
{
    ENetHost * host;
    ENetPeer * currentPeer;
    int i;

    if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID)
      return NULL;

    host = (ENetHost *) enet_malloc (sizeof (ENetHost));
    if (host == NULL)
      return NULL;
    memset (host, 0, sizeof (ENetHost));

    host -> peer_list = (ENetPeer **) enet_malloc (ENET_PROTOCOL_MAXIMUM_PEER_ID * sizeof (ENetPeer*));
    if (host -> peer_list == NULL)
    {
       enet_free (host);

       return NULL;
    }
    for (i=0; i < peerCount; i++) {
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
    }

    host -> socket = enet_socket_create (ENET_SOCKET_TYPE_DATAGRAM);
    if (host -> socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind (host -> socket, address) < 0))
    {
       if (host -> socket != ENET_SOCKET_NULL)
         enet_socket_destroy (host -> socket);

       for (i=0; i < peerCount; i++) {
	   enet_free (host -> peer_list[i]);
       }
       enet_free (host -> peer_list);
       enet_free (host);

       return NULL;
    }

    enet_socket_set_option (host -> socket, ENET_SOCKOPT_NONBLOCK, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_BROADCAST, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);

    if (address != NULL && enet_socket_get_address (host -> socket, & host -> address) < 0)   
      host -> address = * address;

    if (! channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
    else
    if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

    host -> randomSeed = (enet_uint32) (size_t) host;
    host -> randomSeed += enet_host_random_seed ();
    host -> randomSeed = (host -> randomSeed << 16) | (host -> randomSeed >> 16);
    host -> channelLimit = channelLimit;
    host -> incomingBandwidth = incomingBandwidth;
    host -> outgoingBandwidth = outgoingBandwidth;
    host -> bandwidthThrottleEpoch = 0;
    host -> recalculateBandwidthLimits = 0;
    host -> mtu = ENET_HOST_DEFAULT_MTU;
    host -> peerCount = peerCount;
    host -> commandCount = 0;
    host -> bufferCount = 0;
    host -> checksum = NULL;
    host -> receivedAddress.host = ENET_HOST_ANY;
    host -> receivedAddress.port = 0;
    host -> receivedData = NULL;
    host -> receivedDataLength = 0;
     
    host -> totalSentData = 0;
    host -> totalSentPackets = 0;
    host -> totalReceivedData = 0;
    host -> totalReceivedPackets = 0;

    host -> connectedPeers = 0;
    host -> bandwidthLimitedPeers = 0;
    host -> duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
    host -> maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
    host -> maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;

    host -> compressor.context = NULL;
    host -> compressor.compress = NULL;
    host -> compressor.decompress = NULL;
    host -> compressor.destroy = NULL;

    host -> intercept = NULL;

    enet_list_clear (& host -> dispatchQueue);

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];
       currentPeer -> host = host;
       currentPeer -> incomingPeerID = i;
       currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
       currentPeer -> data = NULL;

       enet_list_clear (& currentPeer -> acknowledgements);
       enet_list_clear (& currentPeer -> sentReliableCommands);
       enet_list_clear (& currentPeer -> sentUnreliableCommands);
       enet_list_clear (& currentPeer -> outgoingReliableCommands);
       enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
       enet_list_clear (& currentPeer -> dispatchedCommands);

       enet_peer_reset (currentPeer);
    }

    return host;
}